

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd.c
# Opt level: O2

list MSD1(list a,int n)

{
  byte bVar1;
  int pos;
  list plVar2;
  stack *psVar3;
  int iVar4;
  long lVar5;
  int size;
  list h;
  list t;
  bucket_conflict1 *b;
  uint ch;
  ulong uVar6;
  character local_40;
  character chmin;
  list local_38;
  
  if (1 < n) {
    initmem(stackmem,0x18,(uint)n / 0x32);
    push(a,(list)0x0,n,0);
    local_38 = (list)0x0;
    while (psVar3 = stackp, stackp != (stack *)0x0) {
      stackp = (stack *)deallocmem(stackmem,0x18);
      if (psVar3->size == 0) {
        psVar3->tail->next = local_38;
        local_38 = psVar3->head;
      }
      else {
        pos = psVar3->pos;
        local_40 = 0;
        chmin = 0xff;
        uVar6 = (ulong)psVar3->head->str[pos];
        h = psVar3->head;
LAB_0022228d:
        plVar2 = h;
        iVar4 = 1;
        while( true ) {
          size = iVar4;
          t = plVar2;
          plVar2 = t->next;
          ch = (uint)uVar6;
          if (plVar2 == (list)0x0) break;
          bVar1 = plVar2->str[pos];
          iVar4 = size + 1;
          if (ch != bVar1) goto code_r0x002222ae;
        }
        intobucket((bucket_conflict1 *)(&bucketing_b + uVar6 * 3),h,t,size,ch,&chmin,&local_40);
        if (bucketing_b != 0) {
          _DAT_00c79c50 = 0;
          ontostack((bucket_conflict1 *)&bucketing_b,pos);
        }
        lVar5 = (long)local_40;
        for (b = (bucket_conflict1 *)(&bucketing_b + (long)chmin * 3);
            b <= (bucket_conflict1 *)(&bucketing_b + lVar5 * 3); b = b + 1) {
          if (b->head != (list)0x0) {
            ontostack(b,pos + 1);
          }
        }
      }
    }
    freemem(stackmem);
    a = local_38;
  }
  return a;
code_r0x002222ae:
  intobucket((bucket_conflict1 *)(&bucketing_b + uVar6 * 3),h,t,size,ch,&chmin,&local_40);
  uVar6 = (ulong)(uint)bVar1;
  h = plVar2;
  goto LAB_0022228d;
}

Assistant:

list MSD1(list a, int n)
{
   list res = NULL;
   stack *s;

   if (n < 2) return a;
   initmem(stackmem, sizeof(struct stackrec), n/50);
   push(a, NULL, n, 0);

   while (!stackempty()) {
      s = pop();
      if (!s->size) {   /* sorted */
         s->tail->next = res;
         res = s->head;
         continue;
      }
      bucketing(s->head, s->pos);
   }

   freemem(stackmem);
   return res;
}